

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O2

QList<QNetworkProxy> * __thiscall
QGlobalNetworkProxy::proxyForQuery
          (QList<QNetworkProxy> *__return_storage_ptr__,QGlobalNetworkProxy *this,
          QNetworkProxyQuery *query)

{
  QNetworkProxyFactory *pQVar1;
  QNetworkProxy *args;
  QNetworkProxyPrivate *pQVar2;
  bool bVar3;
  char cVar4;
  long in_FS_OFFSET;
  QLatin1String QVar5;
  QArrayDataPointer<QNetworkProxy> local_c8;
  char *local_b0;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_88;
  QNetworkProxy local_70;
  QArrayDataPointer<char16_t> local_68;
  QHostAddress parsed;
  undefined1 local_40 [16];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_40._0_8_ = this;
  QRecursiveMutex::lock(&this->mutex);
  local_40[8] = true;
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QNetworkProxy *)0x0;
  parsed.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QHostAddress::QHostAddress(&parsed);
  local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkProxyQuery::url((QNetworkProxyQuery *)&local_c8);
  QUrl::host(&local_68,&local_c8,0x7f00000);
  QUrl::~QUrl((QUrl *)&local_c8);
  local_c8.d._0_4_ = 9;
  local_c8.d._4_4_ = 0;
  local_c8.ptr._0_4_ = 0x23d5fe;
  local_c8.ptr._4_4_ = 0;
  bVar3 = ::operator==((QString *)&local_68,(QLatin1StringView *)&local_c8);
  if (bVar3) {
LAB_001afeae:
    local_c8.size._0_4_ = 0;
    local_c8.size._4_4_ = 0;
    local_c8.d._0_4_ = 0;
    local_c8.d._4_4_ = 0;
    local_c8.ptr._0_4_ = 0;
    local_c8.ptr._4_4_ = 0;
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    local_88.size = 0;
    local_a8.d = (Data *)0x0;
    local_a8.ptr = (char16_t *)0x0;
    local_a8.size = 0;
    QNetworkProxy::QNetworkProxy
              (&local_70,NoProxy,(QString *)&local_c8,0,(QString *)&local_88,(QString *)&local_a8);
    QList<QNetworkProxy>::emplaceBack<QNetworkProxy>(__return_storage_ptr__,&local_70);
    QNetworkProxy::~QNetworkProxy(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  }
  else {
    QVar5.m_data = (char *)0xa;
    QVar5.m_size = (qsizetype)&local_68;
    cVar4 = QString::startsWith(QVar5,0x243528);
    if (cVar4 != '\0') goto LAB_001afeae;
    bVar3 = QHostAddress::setAddress(&parsed,(QString *)&local_68);
    if (bVar3) {
      bVar3 = QHostAddress::isLoopback(&parsed);
      if (bVar3) goto LAB_001afeae;
    }
    pQVar1 = this->applicationLevelProxyFactory;
    if (pQVar1 == (QNetworkProxyFactory *)0x0) {
      args = this->applicationLevelProxy;
      if (((args != (QNetworkProxy *)0x0) &&
          (pQVar2 = (args->d).d.ptr, pQVar2 != (QNetworkProxyPrivate *)0x0)) &&
         (pQVar2->type != DefaultProxy)) {
        QList<QNetworkProxy>::emplaceBack<QNetworkProxy_const&>(__return_storage_ptr__,args);
        goto LAB_001aff21;
      }
      if (this->useSystemProxies != true) goto LAB_001afeae;
      QNetworkProxyFactory::systemProxyForQuery((QList<QNetworkProxy> *)&local_c8,query);
      QArrayDataPointer<QNetworkProxy>::operator=(&__return_storage_ptr__->d,&local_c8);
      QArrayDataPointer<QNetworkProxy>::~QArrayDataPointer(&local_c8);
    }
    else {
      (*pQVar1->_vptr_QNetworkProxyFactory[2])(&local_c8,pQVar1,query);
      QArrayDataPointer<QNetworkProxy>::operator=(&__return_storage_ptr__->d,&local_c8);
      QArrayDataPointer<QNetworkProxy>::~QArrayDataPointer(&local_c8);
      if ((__return_storage_ptr__->d).size != 0) goto LAB_001aff21;
      local_c8.d._0_4_ = 2;
      local_c8.size._4_4_ = 0;
      local_c8.d._4_4_ = 0;
      local_c8.ptr._0_4_ = 0;
      local_c8.ptr._4_4_ = 0;
      local_c8.size._0_4_ = 0;
      local_b0 = "default";
      QMessageLogger::warning
                ((char *)&local_c8,
                 "QNetworkProxyFactory: factory %p has returned an empty result set",
                 this->applicationLevelProxyFactory);
    }
    local_c8.size._4_4_ = 0;
    local_c8.size._0_4_ = 0;
    local_c8.ptr._4_4_ = 0;
    local_c8.ptr._0_4_ = 0;
    local_c8.d._4_4_ = 0;
    local_c8.d._0_4_ = 0;
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    local_88.size = 0;
    local_a8.d = (Data *)0x0;
    local_a8.ptr = (char16_t *)0x0;
    local_a8.size = 0;
    QNetworkProxy::QNetworkProxy
              (&local_70,NoProxy,(QString *)&local_c8,0,(QString *)&local_88,(QString *)&local_a8);
    QList<QNetworkProxy>::emplaceBack<QNetworkProxy>(__return_storage_ptr__,&local_70);
    QNetworkProxy::~QNetworkProxy(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
LAB_001aff21:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QHostAddress::~QHostAddress(&parsed);
  QMutexLocker<QRecursiveMutex>::~QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QNetworkProxy> QGlobalNetworkProxy::proxyForQuery(const QNetworkProxyQuery &query)
{
    QMutexLocker locker(&mutex);

    QList<QNetworkProxy> result;

    // don't look for proxies for a local connection
    QHostAddress parsed;
    QString hostname = query.url().host();
    if (hostname == "localhost"_L1 || hostname.startsWith("localhost."_L1)
            || (parsed.setAddress(hostname) && (parsed.isLoopback()))) {
        result << QNetworkProxy(QNetworkProxy::NoProxy);
        return result;
    }

    if (!applicationLevelProxyFactory) {
        if (applicationLevelProxy
            && applicationLevelProxy->type() != QNetworkProxy::DefaultProxy) {
            result << *applicationLevelProxy;
        } else if (useSystemProxies) {
            result = QNetworkProxyFactory::systemProxyForQuery(query);

            // Make sure NoProxy is in the list, so that QTcpServer can work:
            // it searches for the first proxy that can has the ListeningCapability capability
            // if none have (as is the case with HTTP proxies), it fails to bind.
            // NoProxy allows it to fallback to the 'no proxy' case and bind.
            result << QNetworkProxy(QNetworkProxy::NoProxy);
        } else {
            result << QNetworkProxy(QNetworkProxy::NoProxy);
        }
        return result;
    }

    // we have a factory
    result = applicationLevelProxyFactory->queryProxy(query);
    if (result.isEmpty()) {
        qWarning("QNetworkProxyFactory: factory %p has returned an empty result set",
                 applicationLevelProxyFactory);
        result << QNetworkProxy(QNetworkProxy::NoProxy);
    }
    return result;
}